

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall
Catch::Section::Section(Section *this,SourceLineInfo *_lineInfo,StringRef _name,char *param_3)

{
  size_t sVar1;
  int iVar2;
  IResultCapture *pIVar3;
  string local_a8;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  string local_60;
  SourceLineInfo local_40;
  char *local_30;
  char *param_3_local;
  SourceLineInfo *_lineInfo_local;
  Section *this_local;
  StringRef _name_local;
  
  _name_local.m_start = (char *)_name.m_size;
  this_local = (Section *)_name.m_start;
  local_30 = param_3;
  param_3_local = (char *)_lineInfo;
  _lineInfo_local = (SourceLineInfo *)this;
  SourceLineInfo::SourceLineInfo(&local_40,"invalid",0xffffffffffffffff);
  std::__cxx11::string::string((string *)&local_60);
  SectionInfo::SectionInfo(&this->m_info,&local_40,&local_60,(char *)0x0);
  std::__cxx11::string::~string((string *)&local_60);
  Counts::Counts(&this->m_assertions);
  pIVar3 = getResultCapture();
  local_88 = this_local._0_4_;
  uStack_84 = this_local._4_4_;
  uStack_80 = _name_local.m_start._0_4_;
  uStack_7c = _name_local.m_start._4_4_;
  iVar2 = (*pIVar3->_vptr_IResultCapture[3])
                    (pIVar3,this_local,_name_local.m_start,param_3_local,&this->m_assertions);
  this->m_sectionIncluded = (bool)((byte)iVar2 & 1);
  Timer::Timer(&this->m_timer);
  if ((this->m_sectionIncluded & 1U) != 0) {
    StringRef::operator_cast_to_string(&local_a8,(StringRef *)&this_local);
    std::__cxx11::string::operator=((string *)this,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    sVar1 = *(size_t *)(param_3_local + 8);
    (this->m_info).lineInfo.file = *(char **)param_3_local;
    (this->m_info).lineInfo.line = sVar1;
    Timer::start(&this->m_timer);
  }
  return;
}

Assistant:

Section::Section( SourceLineInfo const& _lineInfo,
                      StringRef _name,
                      const char* const ):
        m_info( { "invalid", static_cast<std::size_t>( -1 ) }, std::string{} ),
        m_sectionIncluded(
            getResultCapture().sectionStarted( _name, _lineInfo, m_assertions ) ) {
        // We delay initialization the SectionInfo member until we know
        // this section needs it, so we avoid allocating std::string for name.
        // We also delay timer start to avoid the potential syscall unless we
        // will actually use the result.
        if ( m_sectionIncluded ) {
            m_info.name = static_cast<std::string>( _name );
            m_info.lineInfo = _lineInfo;
            m_timer.start();
        }
    }